

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# close.c
# Opt level: O3

void lws_remove_child_from_any_parent(lws *wsi)

{
  lws *plVar1;
  lws_protocols *plVar2;
  lws *plVar3;
  lws **pplVar4;
  
  plVar3 = wsi->parent;
  if (plVar3 != (lws *)0x0) {
    plVar1 = plVar3->child_list;
    if (plVar1 == (lws *)0x0) {
LAB_00110a73:
      _lws_log(1,"%s: failed to detach from parent\n","lws_remove_child_from_any_parent");
    }
    else {
      if (plVar1 == wsi) {
        pplVar4 = &plVar3->child_list;
      }
      else {
        do {
          plVar3 = plVar1;
          plVar1 = plVar3->sibling_list;
          if (plVar1 == (lws *)0x0) goto LAB_00110a73;
        } while (plVar1 != wsi);
        pplVar4 = &plVar3->sibling_list;
      }
      _lws_log(8,"%s: detach %p from parent %p\n","lws_remove_child_from_any_parent",wsi);
      plVar2 = wsi->parent->protocol;
      if (plVar2 != (lws_protocols *)0x0) {
        (*plVar2->callback)(wsi,LWS_CALLBACK_CHILD_CLOSING,wsi->parent->user_space,wsi,0);
      }
      *pplVar4 = wsi->sibling_list;
    }
    wsi->parent = (lws *)0x0;
  }
  return;
}

Assistant:

void
lws_remove_child_from_any_parent(struct lws *wsi)
{
	struct lws **pwsi;
	int seen = 0;

	if (!wsi->parent)
		return;

	/* detach ourselves from parent's child list */
	pwsi = &wsi->parent->child_list;
	while (*pwsi) {
		if (*pwsi == wsi) {
			lwsl_info("%s: detach %p from parent %p\n", __func__,
				  wsi, wsi->parent);

			if (wsi->parent->protocol)
				wsi->parent->protocol->callback(wsi,
						LWS_CALLBACK_CHILD_CLOSING,
					       wsi->parent->user_space, wsi, 0);

			*pwsi = wsi->sibling_list;
			seen = 1;
			break;
		}
		pwsi = &(*pwsi)->sibling_list;
	}
	if (!seen)
		lwsl_err("%s: failed to detach from parent\n", __func__);

	wsi->parent = NULL;
}